

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

BasicHeapType __thiscall wasm::HeapType::getUnsharedTop(HeapType *this)

{
  BasicHeapType BVar1;
  uint uVar2;
  
  BVar1 = getUnsharedBottom(this);
  uVar2 = (BVar1 << 0x1d | BVar1 - ext >> 3) - 10;
  if (uVar2 < 5) {
    return *(BasicHeapType *)(&DAT_00e5b7c8 + (ulong)uVar2 * 4);
  }
  handle_unreachable("unexpected type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                     ,0x472);
}

Assistant:

HeapType::BasicHeapType HeapType::getUnsharedTop() const {
  switch (getUnsharedBottom()) {
    case none:
      return any;
    case nofunc:
      return func;
    case nocont:
      return cont;
    case noext:
      return ext;
    case noexn:
      return exn;
    case ext:
    case func:
    case cont:
    case any:
    case eq:
    case i31:
    case struct_:
    case array:
    case exn:
    case string:
      break;
  }
  WASM_UNREACHABLE("unexpected type");
}